

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

SharedCalendar * __thiscall
icu_63::LocaleCacheKey<icu_63::SharedCalendar>::createObject
          (LocaleCacheKey<icu_63::SharedCalendar> *this,void *param_1,UErrorCode *status)

{
  UBool UVar1;
  Calendar *calToAdopt;
  LocaleCacheKey<icu_63::SharedCalendar> *this_00;
  UErrorCode *size;
  LocaleCacheKey<icu_63::SharedCalendar> *local_60;
  SharedCalendar *shared;
  Calendar *calendar;
  UErrorCode *status_local;
  void *param_1_local;
  LocaleCacheKey<icu_63::SharedCalendar> *this_local;
  
  size = status;
  calToAdopt = Calendar::makeInstance(&this->fLoc,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_00 = (LocaleCacheKey<icu_63::SharedCalendar> *)
              UMemory::operator_new((UMemory *)0x20,(size_t)size);
    local_60 = (LocaleCacheKey<icu_63::SharedCalendar> *)0x0;
    if (this_00 != (LocaleCacheKey<icu_63::SharedCalendar> *)0x0) {
      SharedCalendar::SharedCalendar((SharedCalendar *)this_00,calToAdopt);
      local_60 = this_00;
    }
    if (local_60 == (LocaleCacheKey<icu_63::SharedCalendar> *)0x0) {
      if (calToAdopt != (Calendar *)0x0) {
        (*(calToAdopt->super_UObject)._vptr_UObject[1])();
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
      this_local = (LocaleCacheKey<icu_63::SharedCalendar> *)0x0;
    }
    else {
      SharedObject::addRef((SharedObject *)local_60);
      this_local = local_60;
    }
  }
  else {
    this_local = (LocaleCacheKey<icu_63::SharedCalendar> *)0x0;
  }
  return (SharedCalendar *)this_local;
}

Assistant:

U_I18N_API
const SharedCalendar *LocaleCacheKey<SharedCalendar>::createObject(
        const void * /*unusedCreationContext*/, UErrorCode &status) const {
    Calendar *calendar = Calendar::makeInstance(fLoc, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    SharedCalendar *shared = new SharedCalendar(calendar);
    if (shared == NULL) {
        delete calendar;
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    shared->addRef();
    return shared;
}